

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  uv__queue *__n;
  uv__queue *puVar5;
  int *piVar6;
  char *__s;
  size_t sVar7;
  uv_handle_t *handle;
  void *unaff_R12;
  code *unaff_R14;
  long lVar8;
  uv_loop_t *unaff_R15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  uv_os_fd_t fds_stdout [2];
  uv_os_fd_t fds_stdin [2];
  uv_write_t write_req;
  uchar ubuf [1023];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_stdio_container_t child_stdio [2];
  uv_pipe_t pipe_stdin_child;
  uv_process_t child_req;
  undefined1 auStack_36e8 [24];
  uv_loop_t *puStack_36d0;
  uv__queue *puStack_36c8;
  uv__queue *puStack_36c0;
  uv_loop_t uStack_36b8;
  uv_loop_t *puStack_32b0;
  void *pvStack_32a8;
  uv_pipe_t *puStack_32a0;
  uv_loop_t *puStack_3298;
  long lStack_3290;
  long lStack_3288;
  uv__queue uStack_3280;
  undefined1 auStack_3270 [8];
  char *pcStack_3268;
  uv__queue *puStack_3260;
  uv__queue *puStack_3258;
  anon_union_8_2_bf76bca6_for_active_reqs aStack_3250;
  void *pvStack_3248;
  undefined8 uStack_3240;
  void *pvStack_3238;
  void *pvStack_3230;
  void *pvStack_3228;
  uv_loop_t auStack_3220 [12];
  uv_loop_t *puStack_978;
  void *pvStack_970;
  uv_pipe_t *puStack_968;
  uv_loop_t *puStack_960;
  long local_950;
  long local_948;
  uv_os_fd_t local_940;
  uv_os_fd_t local_93c;
  uv_os_fd_t local_938;
  uv_os_fd_t local_934;
  uv_buf_t local_930;
  uv_write_t local_920;
  void *local_858 [129];
  uv_pipe_t local_450;
  uv_pipe_t local_368;
  undefined1 local_280 [240];
  uv_pipe_t *local_190;
  undefined4 local_188;
  uv_loop_t *local_180;
  uv_pipe_t local_178;
  uv_process_t local_90;
  
  puStack_960 = (uv_loop_t *)0x1bfeb0;
  init_process_options("spawn_helper9",exit_cb);
  puStack_960 = (uv_loop_t *)0x1bfeb5;
  puVar3 = uv_default_loop();
  puStack_960 = (uv_loop_t *)0x1bfeca;
  iVar1 = uv_pipe_init(puVar3,&local_178,0);
  local_858[0] = (void *)(long)iVar1;
  local_280._0_8_ = (void *)0x0;
  if (local_858[0] == (void *)0x0) {
    puStack_960 = (uv_loop_t *)0x1bff08;
    iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)local_280,0);
    local_858[0] = (void *)(long)iVar1;
    local_368.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c044d;
    puStack_960 = (uv_loop_t *)0x1bff46;
    iVar1 = uv_pipe_init(puVar3,&local_368,0);
    local_858[0] = (void *)(long)iVar1;
    local_450.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c0462;
    puStack_960 = (uv_loop_t *)0x1bff84;
    iVar1 = uv_pipe_init(puVar3,&local_450,0);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c0477;
    puStack_960 = (uv_loop_t *)0x1bffb8;
    iVar1 = uv_pipe(&local_938,0,0);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c0489;
    puStack_960 = (uv_loop_t *)0x1bffec;
    iVar1 = uv_pipe(&local_940,0,0);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c049b;
    puStack_960 = (uv_loop_t *)0x1c0023;
    iVar1 = uv_pipe_open(&local_178,local_938);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c04ad;
    puStack_960 = (uv_loop_t *)0x1c005a;
    iVar1 = uv_pipe_open((uv_pipe_t *)local_280,local_93c);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c04bf;
    puStack_960 = (uv_loop_t *)0x1c0091;
    iVar1 = uv_pipe_open(&local_368,local_934);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c04d1;
    puStack_960 = (uv_loop_t *)0x1c00c8;
    iVar1 = uv_pipe_open(&local_450,local_940);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c04e3;
    puStack_960 = (uv_loop_t *)0x1c00fb;
    iVar1 = uv_is_readable((uv_stream_t *)&local_178);
    if (iVar1 == 0) goto LAB_001c04f5;
    puStack_960 = (uv_loop_t *)0x1c0110;
    iVar1 = uv_is_writable((uv_stream_t *)local_280);
    if (iVar1 == 0) goto LAB_001c04fa;
    puStack_960 = (uv_loop_t *)0x1c0125;
    iVar1 = uv_is_writable((uv_stream_t *)&local_368);
    if (iVar1 == 0) goto LAB_001c04ff;
    puStack_960 = (uv_loop_t *)0x1c013a;
    iVar1 = uv_is_readable((uv_stream_t *)&local_450);
    if (iVar1 == 0) goto LAB_001c0504;
    unaff_R14 = (code *)&local_178;
    puStack_960 = (uv_loop_t *)0x1c0152;
    iVar1 = uv_is_writable((uv_stream_t *)unaff_R14);
    unaff_R15 = (uv_loop_t *)local_280;
    puStack_960 = (uv_loop_t *)0x1c0164;
    iVar2 = uv_is_readable((uv_stream_t *)unaff_R15);
    local_858[0] = (void *)(long)iVar2;
    unaff_R12 = (void *)(long)iVar1;
    local_920.data = unaff_R12;
    if (local_858[0] != unaff_R12) goto LAB_001c0509;
    puStack_960 = (uv_loop_t *)0x1c0196;
    iVar1 = uv_is_readable((uv_stream_t *)&local_368);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = unaff_R12;
    if (local_858[0] != unaff_R12) goto LAB_001c051b;
    puStack_960 = (uv_loop_t *)0x1c01c5;
    iVar1 = uv_is_writable((uv_stream_t *)&local_450);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = unaff_R12;
    if (local_858[0] != unaff_R12) goto LAB_001c052d;
    options.stdio = (uv_stdio_container_t *)(local_280 + 0xe8);
    local_280._232_4_ = 4;
    local_188 = 4;
    options.stdio_count = 2;
    puStack_960 = (uv_loop_t *)0x1c0229;
    local_190 = (uv_pipe_t *)unaff_R14;
    local_180 = unaff_R15;
    iVar1 = uv_spawn(puVar3,&local_90,&options);
    local_858[0] = (void *)(long)iVar1;
    local_920.data = (void *)0x0;
    if (local_858[0] != (void *)0x0) goto LAB_001c053f;
    lVar8 = 0;
    puStack_960 = (uv_loop_t *)0x1c0261;
    uv_close((uv_handle_t *)&local_178,(uv_close_cb)0x0);
    puStack_960 = (uv_loop_t *)0x1c0270;
    uv_close((uv_handle_t *)local_280,(uv_close_cb)0x0);
    puStack_960 = (uv_loop_t *)0x1c0282;
    local_930 = uv_buf_init((char *)local_858,0x3ff);
    do {
      *(char *)((long)local_858 + lVar8) = (char)lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x3ff);
    puStack_960 = (uv_loop_t *)0x1c02b3;
    memset(output,0,0x3ff);
    puStack_960 = (uv_loop_t *)0x1c02d6;
    iVar1 = uv_write(&local_920,(uv_stream_t *)&local_368,&local_930,1,write_cb);
    local_948 = (long)iVar1;
    local_950 = 0;
    unaff_R14 = (code *)0x3ff;
    if (local_948 != 0) goto LAB_001c0551;
    puStack_960 = (uv_loop_t *)0x1c0311;
    iVar1 = uv_read_start((uv_stream_t *)&local_450,on_alloc,on_read);
    local_948 = (long)iVar1;
    local_950 = 0;
    if (local_948 != 0) goto LAB_001c0560;
    puStack_960 = (uv_loop_t *)0x1c033b;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    local_948 = (long)iVar1;
    local_950 = 0;
    if (local_948 != 0) goto LAB_001c056f;
    local_948 = 1;
    local_950 = (long)exit_cb_called;
    if (local_950 != 1) goto LAB_001c057e;
    local_948 = 3;
    local_950 = (long)close_cb_called;
    if (local_950 != 3) goto LAB_001c058d;
    puStack_960 = (uv_loop_t *)0x1c03be;
    iVar1 = memcmp(local_858,output,0x3ff);
    local_948 = (long)iVar1;
    local_950 = 0;
    if (local_948 != 0) goto LAB_001c059c;
    puStack_960 = (uv_loop_t *)0x1c03ef;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_960 = (uv_loop_t *)0x1c03f9;
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_948 = 0;
    puStack_960 = (uv_loop_t *)0x1c040a;
    iVar1 = uv_loop_close(puVar3);
    local_950 = (long)iVar1;
    if (local_948 == local_950) {
      puStack_960 = (uv_loop_t *)0x1c0426;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_960 = (uv_loop_t *)0x1c044d;
    run_test_spawn_inherit_streams_cold_1();
LAB_001c044d:
    puStack_960 = (uv_loop_t *)0x1c0462;
    run_test_spawn_inherit_streams_cold_2();
LAB_001c0462:
    puStack_960 = (uv_loop_t *)0x1c0477;
    run_test_spawn_inherit_streams_cold_3();
LAB_001c0477:
    puStack_960 = (uv_loop_t *)0x1c0489;
    run_test_spawn_inherit_streams_cold_4();
LAB_001c0489:
    puStack_960 = (uv_loop_t *)0x1c049b;
    run_test_spawn_inherit_streams_cold_5();
LAB_001c049b:
    puStack_960 = (uv_loop_t *)0x1c04ad;
    run_test_spawn_inherit_streams_cold_6();
LAB_001c04ad:
    puStack_960 = (uv_loop_t *)0x1c04bf;
    run_test_spawn_inherit_streams_cold_7();
LAB_001c04bf:
    puStack_960 = (uv_loop_t *)0x1c04d1;
    run_test_spawn_inherit_streams_cold_8();
LAB_001c04d1:
    puStack_960 = (uv_loop_t *)0x1c04e3;
    run_test_spawn_inherit_streams_cold_9();
LAB_001c04e3:
    puStack_960 = (uv_loop_t *)0x1c04f5;
    run_test_spawn_inherit_streams_cold_10();
LAB_001c04f5:
    puStack_960 = (uv_loop_t *)0x1c04fa;
    run_test_spawn_inherit_streams_cold_25();
LAB_001c04fa:
    puStack_960 = (uv_loop_t *)0x1c04ff;
    run_test_spawn_inherit_streams_cold_24();
LAB_001c04ff:
    puStack_960 = (uv_loop_t *)0x1c0504;
    run_test_spawn_inherit_streams_cold_23();
LAB_001c0504:
    puStack_960 = (uv_loop_t *)0x1c0509;
    run_test_spawn_inherit_streams_cold_22();
LAB_001c0509:
    puStack_960 = (uv_loop_t *)0x1c051b;
    run_test_spawn_inherit_streams_cold_11();
LAB_001c051b:
    puStack_960 = (uv_loop_t *)0x1c052d;
    run_test_spawn_inherit_streams_cold_12();
LAB_001c052d:
    puStack_960 = (uv_loop_t *)0x1c053f;
    run_test_spawn_inherit_streams_cold_13();
LAB_001c053f:
    puStack_960 = (uv_loop_t *)0x1c0551;
    run_test_spawn_inherit_streams_cold_14();
LAB_001c0551:
    puStack_960 = (uv_loop_t *)0x1c0560;
    run_test_spawn_inherit_streams_cold_15();
LAB_001c0560:
    puStack_960 = (uv_loop_t *)0x1c056f;
    run_test_spawn_inherit_streams_cold_16();
LAB_001c056f:
    puStack_960 = (uv_loop_t *)0x1c057e;
    run_test_spawn_inherit_streams_cold_17();
LAB_001c057e:
    puStack_960 = (uv_loop_t *)0x1c058d;
    run_test_spawn_inherit_streams_cold_18();
LAB_001c058d:
    puStack_960 = (uv_loop_t *)0x1c059c;
    run_test_spawn_inherit_streams_cold_19();
LAB_001c059c:
    puStack_960 = (uv_loop_t *)0x1c05ab;
    run_test_spawn_inherit_streams_cold_20();
  }
  puStack_960 = (uv_loop_t *)run_test_spawn_exercise_sigchld_issue;
  run_test_spawn_inherit_streams_cold_21();
  pvStack_3230 = (void *)0x0;
  pvStack_3228 = (void *)0x0;
  uStack_3240._0_4_ = 0;
  uStack_3240._4_4_ = 0;
  pvStack_3238 = (void *)0x0;
  aStack_3250.unused = (void *)0x0;
  pvStack_3248 = (void *)0x0;
  puStack_3260 = (uv__queue *)0x0;
  puStack_3258 = (uv__queue *)0x0;
  auStack_3270 = (undefined1  [8])0x0;
  pcStack_3268 = (char *)0x0;
  puStack_3298 = (uv_loop_t *)0x1c05f7;
  puStack_978 = puVar3;
  pvStack_970 = unaff_R12;
  puStack_968 = (uv_pipe_t *)unaff_R14;
  puStack_960 = unaff_R15;
  init_process_options("spawn_helper1",exit_cb);
  puStack_3298 = (uv_loop_t *)0x1c05fc;
  puVar4 = uv_default_loop();
  puStack_3298 = (uv_loop_t *)0x1c0612;
  iVar1 = uv_spawn(puVar4,&process,&options);
  auStack_3220[0].data = (void *)(long)iVar1;
  uStack_3280.next = (uv__queue *)0x0;
  if (auStack_3220[0].data == (void *)0x0) {
    puStack_3260 = &uStack_3280;
    uStack_3280.next = (uv__queue *)0x2059e0;
    puVar3 = (uv_loop_t *)auStack_3270;
    pcStack_3268 = "program-that-had-better-not-exist";
    uStack_3280.prev = (uv__queue *)0x0;
    auStack_3270 = (undefined1  [8])fail_cb;
    pvStack_3248 = (void *)((ulong)pvStack_3248 & 0xffffffff00000000);
    unaff_R12 = (void *)0x0;
    unaff_R14 = close_cb;
    do {
      puStack_3298 = (uv_loop_t *)0x1c0676;
      puVar4 = uv_default_loop();
      unaff_R15 = (uv_loop_t *)((long)unaff_R12 + (long)(auStack_3220[0].reserved + -7));
      puStack_3298 = (uv_loop_t *)0x1c068c;
      iVar1 = uv_spawn(puVar4,(uv_process_t *)unaff_R15,(uv_process_options_t *)puVar3);
      if (iVar1 != -2) {
        lStack_3288 = (long)iVar1;
        lStack_3290 = -0xd;
        if (lStack_3288 != -0xd) {
          puStack_3298 = (uv_loop_t *)0x1c07a7;
          run_test_spawn_exercise_sigchld_issue_cold_2();
          goto LAB_001c07a7;
        }
      }
      puStack_3298 = (uv_loop_t *)0x1c06ba;
      uv_close((uv_handle_t *)unaff_R15,close_cb);
      unaff_R12 = (void *)((long)unaff_R12 + 0x68);
    } while (unaff_R12 != (void *)0x28a0);
    puStack_3298 = (uv_loop_t *)0x1c06cc;
    puVar4 = uv_default_loop();
    puStack_3298 = (uv_loop_t *)0x1c06d6;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    lStack_3288 = (long)iVar1;
    lStack_3290 = 0;
    if (lStack_3288 != 0) goto LAB_001c07b6;
    lStack_3288 = 1;
    lStack_3290 = (long)exit_cb_called;
    if (lStack_3290 != 1) goto LAB_001c07c3;
    lStack_3288 = 0x65;
    lStack_3290 = (long)close_cb_called;
    if (lStack_3290 == 0x65) {
      puStack_3298 = (uv_loop_t *)0x1c073f;
      puVar3 = uv_default_loop();
      puStack_3298 = (uv_loop_t *)0x1c0753;
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      puStack_3298 = (uv_loop_t *)0x1c075d;
      uv_run(puVar3,UV_RUN_DEFAULT);
      lStack_3288 = 0;
      puStack_3298 = (uv_loop_t *)0x1c076b;
      puVar4 = uv_default_loop();
      puStack_3298 = (uv_loop_t *)0x1c0773;
      iVar1 = uv_loop_close(puVar4);
      lStack_3290 = (long)iVar1;
      if (lStack_3288 == lStack_3290) {
        puStack_3298 = (uv_loop_t *)0x1c0789;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c07dd;
    }
  }
  else {
LAB_001c07a7:
    puStack_3298 = (uv_loop_t *)0x1c07b6;
    run_test_spawn_exercise_sigchld_issue_cold_1();
LAB_001c07b6:
    puStack_3298 = (uv_loop_t *)0x1c07c3;
    run_test_spawn_exercise_sigchld_issue_cold_3();
LAB_001c07c3:
    puStack_3298 = (uv_loop_t *)0x1c07d0;
    run_test_spawn_exercise_sigchld_issue_cold_4();
  }
  puStack_3298 = (uv_loop_t *)0x1c07dd;
  run_test_spawn_exercise_sigchld_issue_cold_5();
LAB_001c07dd:
  puStack_3298 = (uv_loop_t *)spawn_stdin_stdout;
  run_test_spawn_exercise_sigchld_issue_cold_6();
  puStack_32b0 = puVar3;
  pvStack_32a8 = unaff_R12;
  puStack_32a0 = (uv_pipe_t *)unaff_R14;
  puStack_3298 = unaff_R15;
LAB_001c07fd:
  puStack_36d0 = (uv_loop_t *)0x1c080c;
  __n = (uv__queue *)read(0,&uStack_36b8,0x400);
  puVar5 = __n;
  if (__n == (uv__queue *)0xffffffffffffffff) goto code_r0x001c0815;
  goto LAB_001c081f;
code_r0x001c0815:
  puStack_36d0 = (uv_loop_t *)0x1c081a;
  puVar5 = (uv__queue *)__errno_location();
  if (*(int *)&puVar5->next != 4) {
LAB_001c081f:
    if (__n == (uv__queue *)0x0) {
      return (int)puVar5;
    }
    puStack_36c8 = (uv__queue *)0x0;
    puVar3 = unaff_R15;
    puStack_36c0 = __n;
    puVar4 = &uStack_36b8;
    if ((long)__n < 1) goto LAB_001c08a8;
    for (; puVar3 = puVar4, puStack_36c8 = (uv__queue *)0x0, __n != (uv__queue *)0x0;
        __n = (uv__queue *)((long)__n - (long)puVar5)) {
      do {
        puStack_36d0 = (uv_loop_t *)0x1c0854;
        puVar5 = (uv__queue *)write(1,puVar3,(size_t)__n);
        if (puVar5 != (uv__queue *)0xffffffffffffffff) break;
        puStack_36d0 = (uv_loop_t *)0x1c0862;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      puStack_36c8 = (uv__queue *)0x0;
      puStack_36c0 = puVar5;
      if ((long)puVar5 < 0) {
        puStack_36d0 = (uv_loop_t *)0x1c08a8;
        spawn_stdin_stdout_cold_2();
        goto LAB_001c08a8;
      }
      unaff_R15 = (uv_loop_t *)
                  ((long)((uv_loop_t *)(puVar3->reserved + -7))->reserved + (long)&puVar5[-4].prev);
      puVar4 = unaff_R15;
    }
  }
  goto LAB_001c07fd;
LAB_001c08a8:
  puStack_36d0 = (uv_loop_t *)run_test_spawn_relative_path;
  spawn_stdin_stdout_cold_1();
  auStack_36e8._8_8_ = &uStack_36b8;
  auStack_36e8._16_8_ = __n;
  puStack_36d0 = puVar3;
  init_process_options("spawn_helper1",exit_cb);
  exepath_size = 0x3fe;
  iVar1 = uv_exepath(exepath,&exepath_size);
  auStack_36e8._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_36e8._0_8_ == (void *)0x0) {
    exepath[exepath_size] = '\0';
    __s = strrchr(exepath,0x2f);
    if (__s == (char *)0x0) {
      __s = strrchr(exepath,0x5c);
    }
    if (__s == (char *)0x0) goto LAB_001c0aa5;
    sVar7 = strlen(__s);
    memmove(__s + 2,__s,sVar7 + 1);
    __s[0] = '\0';
    __s[1] = '.';
    __s[2] = '/';
    options.file = __s + 1;
    options.cwd = exepath;
    *options.args = options.file;
    puVar3 = uv_default_loop();
    iVar1 = uv_spawn(puVar3,&process,&options);
    auStack_36e8._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_36e8._0_8_ != (void *)0x0) goto LAB_001c0aaa;
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_36e8._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_36e8._0_8_ != (void *)0x0) goto LAB_001c0ab7;
    auStack_36e8._0_8_ = (void *)0x1;
    if (exit_cb_called != 1) goto LAB_001c0ac4;
    auStack_36e8._0_8_ = (void *)0x1;
    if (close_cb_called == 1) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_36e8._0_8_ = (void *)0x0;
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if ((void *)auStack_36e8._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c0ade;
    }
  }
  else {
    run_test_spawn_relative_path_cold_1();
LAB_001c0aa5:
    run_test_spawn_relative_path_cold_7();
LAB_001c0aaa:
    run_test_spawn_relative_path_cold_2();
LAB_001c0ab7:
    run_test_spawn_relative_path_cold_3();
LAB_001c0ac4:
    run_test_spawn_relative_path_cold_4();
  }
  run_test_spawn_relative_path_cold_5();
LAB_001c0ade:
  handle = (uv_handle_t *)auStack_36e8;
  run_test_spawn_relative_path_cold_6();
  iVar1 = uv_is_closing(handle);
  if (iVar1 == 0) {
    uv_close(handle,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  uv_os_fd_t fds_stdin[2];
  uv_os_fd_t fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdin_child, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdout_child, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdin_parent, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdout_parent, 0));

  ASSERT_OK(uv_pipe(fds_stdin, 0, 0));
  ASSERT_OK(uv_pipe(fds_stdout, 0, 0));

  ASSERT_OK(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]));
  ASSERT_OK(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]));
  ASSERT_OK(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]));
  ASSERT_OK(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT_EQ(uv_is_readable((uv_stream_t*) &pipe_stdout_child), bidir);
  ASSERT_EQ(uv_is_readable((uv_stream_t*) &pipe_stdin_parent), bidir);
  ASSERT_EQ(uv_is_writable((uv_stream_t*) &pipe_stdout_parent), bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *) &pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *) &pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT_OK(uv_spawn(loop, &child_req, &options));

  uv_close((uv_handle_t*) &pipe_stdin_child, NULL);
  uv_close((uv_handle_t*) &pipe_stdout_child, NULL);

  buf = uv_buf_init((char*) ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*) &pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &pipe_stdout_parent, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}